

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xatlas.cpp
# Opt level: O0

void __thiscall
xatlas::internal::UniformGrid2::computePotentialEdges(UniformGrid2 *this,Vector2 p1,Vector2 p2)

{
  bool bVar1;
  uint32_t uVar2;
  uint32_t uVar3;
  uint *puVar4;
  uint local_40;
  uint32_t local_3c;
  uint32_t edge2;
  uint32_t offset;
  uint32_t cell;
  uint32_t j;
  Vector2 local_28;
  UniformGrid2 *local_20;
  UniformGrid2 *this_local;
  Vector2 p2_local;
  Vector2 p1_local;
  
  local_20 = this;
  this_local = (UniformGrid2 *)p2;
  p2_local = p1;
  Array<unsigned_int>::clear(&this->m_potentialEdges);
  local_28 = p2_local;
  _cell = this_local;
  traverse(this,p2_local,(Vector2)this_local);
  for (offset = 0; uVar3 = offset, uVar2 = Array<unsigned_int>::size(&this->m_traversedCellOffsets),
      uVar3 < uVar2; offset = offset + 1) {
    puVar4 = Array<unsigned_int>::operator[](&this->m_traversedCellOffsets,offset);
    edge2 = *puVar4;
    puVar4 = Array<unsigned_int>::operator[](&this->m_cellDataOffsets,edge2);
    local_3c = *puVar4;
    while (local_3c != 0xffffffff) {
      puVar4 = Array<unsigned_int>::operator[](&this->m_cellData,local_3c);
      local_40 = *puVar4;
      Array<unsigned_int>::push_back(&this->m_potentialEdges,&local_40);
      puVar4 = Array<unsigned_int>::operator[](&this->m_cellData,local_3c + 1);
      local_3c = *puVar4;
    }
  }
  bVar1 = Array<unsigned_int>::isEmpty(&this->m_potentialEdges);
  if (!bVar1) {
    puVar4 = Array<unsigned_int>::data(&this->m_potentialEdges);
    uVar3 = Array<unsigned_int>::size(&this->m_potentialEdges);
    insertionSort<unsigned_int>(puVar4,uVar3);
  }
  return;
}

Assistant:

void computePotentialEdges(Vector2 p1, Vector2 p2)
	{
		m_potentialEdges.clear();
		traverse(p1, p2);
		for (uint32_t j = 0; j < m_traversedCellOffsets.size(); j++) {
			const uint32_t cell = m_traversedCellOffsets[j];
			uint32_t offset = m_cellDataOffsets[cell];
			while (offset != UINT32_MAX) {
				const uint32_t edge2 = m_cellData[offset];
				m_potentialEdges.push_back(edge2);
				offset = m_cellData[offset + 1];
			}
		}
		if (m_potentialEdges.isEmpty())
			return;
		insertionSort(m_potentialEdges.data(), m_potentialEdges.size());
	}